

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::CameraBase::InitMetadata(CameraBase *this,ImageMetadata *metadata)

{
  Float in_stack_0000007c;
  CameraTransform *in_stack_00000080;
  SquareMatrix<4> *in_stack_ffffffffffffff68;
  optional<pbrt::SquareMatrix<4>_> *in_stack_ffffffffffffff70;
  
  CameraTransform::CameraFromWorld(in_stack_00000080,in_stack_0000007c);
  Transform::GetMatrix((Transform *)&stack0xffffffffffffff70);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void CameraBase::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();
}